

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O3

void res_init(ResourceData *pResData,uint8_t *formatVersion,void *inBytes,int32_t length,
             UErrorCode *errorCode)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  
  pResData->pRoot = (int32_t *)inBytes;
  uVar2 = *inBytes;
  pResData->rootRes = uVar2;
  pResData->p16BitUnits = &gEmpty16;
  if (-1 < length) {
    uVar5 = 6;
    if (*formatVersion == '\x01') {
      uVar5 = (uint)(formatVersion[1] != '\0') * 5 + 1;
    }
    if ((uint)length >> 2 < uVar5) goto LAB_00370898;
  }
  if ((uVar2 & 0xe0000000) == 0x40000000 || (uVar2 & 0xf0000000) == 0x20000000) {
    bVar4 = *formatVersion;
    if ((bVar4 == 1) && (formatVersion[1] == '\0')) {
      pResData->localKeyLimit = 0x10000;
LAB_00370840:
      pResData->useNativeStrcmp = '\x01';
      return;
    }
    bVar1 = *(byte *)((long)inBytes + 4);
    if ((4 < bVar1) &&
       ((length < 0 ||
        (((uint)bVar1 * 4 + 4 <= (uint)length && (*(int *)((long)inBytes + 0x10) * 4 <= length))))))
    {
      if ((int)(bVar1 + 1) < *(int *)((long)inBytes + 8)) {
        pResData->localKeyLimit = *(int *)((long)inBytes + 8) << 2;
        bVar4 = *formatVersion;
      }
      if (2 < bVar4) {
        pResData->poolStringIndexLimit = *(uint *)((long)inBytes + 4) >> 8;
      }
      if (bVar1 != 5) {
        uVar2 = *(uint *)((long)inBytes + 0x18);
        bVar4 = (byte)uVar2;
        pResData->noFallback = bVar4 & 1;
        bVar3 = bVar4 >> 2 & 1;
        pResData->poolStringIndexLimit = pResData->poolStringIndexLimit | (uVar2 & 0xf000) << 0xc;
        bVar4 = bVar4 >> 1 & 1;
        pResData->isPoolBundle = bVar4;
        pResData->usesPoolBundle = bVar3;
        pResData->poolStringIndex16Limit = uVar2 >> 0x10;
        if (bVar4 == 0) {
          if ((bVar1 < 8) && (bVar3 != 0)) goto LAB_00370898;
          if (bVar1 < 7) goto LAB_00370840;
        }
        else if (bVar1 < 8) goto LAB_00370898;
        if (*(int *)((long)inBytes + 8) < *(int *)((long)inBytes + 0x1c)) {
          pResData->p16BitUnits =
               (uint16_t *)((long)inBytes + (long)*(int *)((long)inBytes + 8) * 4);
        }
        goto LAB_00370840;
      }
      if ((pResData->isPoolBundle == '\0') && (pResData->usesPoolBundle == '\0')) goto LAB_00370840;
    }
  }
LAB_00370898:
  *errorCode = U_INVALID_FORMAT_ERROR;
  if (pResData->data != (UDataMemory *)0x0) {
    udata_close_63(pResData->data);
    pResData->data = (UDataMemory *)0x0;
  }
  return;
}

Assistant:

static void
res_init(ResourceData *pResData,
         UVersionInfo formatVersion, const void *inBytes, int32_t length,
         UErrorCode *errorCode) {
    UResType rootType;

    /* get the root resource */
    pResData->pRoot=(const int32_t *)inBytes;
    pResData->rootRes=(Resource)*pResData->pRoot;
    pResData->p16BitUnits=&gEmpty16;

    /* formatVersion 1.1 must have a root item and at least 5 indexes */
    if(length>=0 && (length/4)<((formatVersion[0]==1 && formatVersion[1]==0) ? 1 : 1+5)) {
        *errorCode=U_INVALID_FORMAT_ERROR;
        res_unload(pResData);
        return;
    }

    /* currently, we accept only resources that have a Table as their roots */
    rootType=(UResType)RES_GET_TYPE(pResData->rootRes);
    if(!URES_IS_TABLE(rootType)) {
        *errorCode=U_INVALID_FORMAT_ERROR;
        res_unload(pResData);
        return;
    }

    if(formatVersion[0]==1 && formatVersion[1]==0) {
        pResData->localKeyLimit=0x10000;  /* greater than any 16-bit key string offset */
    } else {
        /* bundles with formatVersion 1.1 and later contain an indexes[] array */
        const int32_t *indexes=pResData->pRoot+1;
        int32_t indexLength=indexes[URES_INDEX_LENGTH]&0xff;
        if(indexLength<=URES_INDEX_MAX_TABLE_LENGTH) {
            *errorCode=U_INVALID_FORMAT_ERROR;
            res_unload(pResData);
            return;
        }
        if( length>=0 &&
            (length<((1+indexLength)<<2) ||
             length<(indexes[URES_INDEX_BUNDLE_TOP]<<2))
        ) {
            *errorCode=U_INVALID_FORMAT_ERROR;
            res_unload(pResData);
            return;
        }
        if(indexes[URES_INDEX_KEYS_TOP]>(1+indexLength)) {
            pResData->localKeyLimit=indexes[URES_INDEX_KEYS_TOP]<<2;
        }
        if(formatVersion[0]>=3) {
            // In formatVersion 1, the indexLength took up this whole int.
            // In version 2, bits 31..8 were reserved and always 0.
            // In version 3, they contain bits 23..0 of the poolStringIndexLimit.
            // Bits 27..24 are in indexes[URES_INDEX_ATTRIBUTES] bits 15..12.
            pResData->poolStringIndexLimit=(int32_t)((uint32_t)indexes[URES_INDEX_LENGTH]>>8);
        }
        if(indexLength>URES_INDEX_ATTRIBUTES) {
            int32_t att=indexes[URES_INDEX_ATTRIBUTES];
            pResData->noFallback=(UBool)(att&URES_ATT_NO_FALLBACK);
            pResData->isPoolBundle=(UBool)((att&URES_ATT_IS_POOL_BUNDLE)!=0);
            pResData->usesPoolBundle=(UBool)((att&URES_ATT_USES_POOL_BUNDLE)!=0);
            pResData->poolStringIndexLimit|=(att&0xf000)<<12;  // bits 15..12 -> 27..24
            pResData->poolStringIndex16Limit=(int32_t)((uint32_t)att>>16);
        }
        if((pResData->isPoolBundle || pResData->usesPoolBundle) && indexLength<=URES_INDEX_POOL_CHECKSUM) {
            *errorCode=U_INVALID_FORMAT_ERROR;
            res_unload(pResData);
            return;
        }
        if( indexLength>URES_INDEX_16BIT_TOP &&
            indexes[URES_INDEX_16BIT_TOP]>indexes[URES_INDEX_KEYS_TOP]
        ) {
            pResData->p16BitUnits=(const uint16_t *)(pResData->pRoot+indexes[URES_INDEX_KEYS_TOP]);
        }
    }

    if(formatVersion[0]==1 || U_CHARSET_FAMILY==U_ASCII_FAMILY) {
        /*
         * formatVersion 1: compare key strings in native-charset order
         * formatVersion 2 and up: compare key strings in ASCII order
         */
        pResData->useNativeStrcmp=TRUE;
    }
}